

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinfmt>
               (ostream *stream,long *arg)

{
  plotting_empty_container *this;
  long lVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  lVar1 = *arg;
  if (lVar1 != arg[1]) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
      ::deref((IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
               *)(lVar1 + lVar2));
      std::__ostream_insert<char,std::char_traits<char>>(stream,"%int32",6);
      uVar3 = uVar3 + 1;
      lVar1 = *arg;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)(arg[1] - lVar1 >> 4));
    return;
  }
  this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
  plotting_empty_container::plotting_empty_container(this);
  __cxa_throw(this,&plotting_empty_container::typeinfo,std::length_error::~length_error);
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}